

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmq.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  mqd_t __mqdes;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ssize_t sVar5;
  char **in_RSI;
  int in_EDI;
  char *msg;
  int type;
  ssize_t ret;
  uint prio;
  bool running;
  char *buf;
  size_t buflen;
  mqd_t qid;
  int opt;
  char *ops;
  string QName;
  char *in_stack_ffffffffffffff58;
  FILE *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  long lVar6;
  allocator<char> local_31;
  string local_30 [32];
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::allocator<char>::~allocator(&local_31);
  while( true ) {
    uVar1 = getopt(local_8,local_10,"hq?");
    if (uVar1 == 0xffffffff) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      mq_unlink(pcVar4);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      __mqdes = mq_open(pcVar4,0xc0,0x1a4,0);
      if (__mqdes < 0) {
        perror("mq_open");
        exit(1);
      }
      lVar6 = 0xffff;
      pcVar4 = (char *)malloc(0xffff);
      uVar1 = 0x1000000;
      do {
        sVar5 = mq_receive(__mqdes,pcVar4,lVar6 - 2,(uint *)&stack0xffffffffffffff90);
        if (sVar5 < 4) {
          perror("mq_receive");
          uVar1 = 0;
        }
        else {
          pcVar4[sVar5] = '\0';
          uVar2 = atoi(pcVar4);
          printf("GOT MSG %d %s\n",(ulong)uVar2,pcVar4 + 1);
        }
      } while ((uVar1 & 0x1000000) != 0);
      iVar3 = mq_close(__mqdes);
      if (iVar3 < 0) {
        perror("mq_close");
        abort();
      }
      free(pcVar4);
      local_4 = 0;
      std::__cxx11::string::~string(local_30);
      return local_4;
    }
    if (uVar1 == 0x68) {
      print_help(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      exit(0);
    }
    if (uVar1 != 0x71) break;
    std::__cxx11::string::operator=(local_30,_optarg);
  }
  printf("Unknown option \'%c\'\n",(ulong)uVar1);
  print_help(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    std::string QName = "/liblogger";
    const char *ops = "hq?";
    int opt = 0;

    while( (opt = getopt(argc, argv, ops)) != -1) {
        switch(opt) {
            case 'h':
                print_help(stdout, argv[0]);
                exit(EXIT_SUCCESS);
                break;
            case 'q':
                QName = optarg;
                break;
            default:
                printf("Unknown option '%c'\n", opt);
                print_help(stderr, argv[0]);
                exit(EXIT_FAILURE);
                break;
        }
    }
    
    mq_unlink(QName.c_str());

    mqd_t qid = mq_open(QName.c_str(), O_RDONLY | O_CREAT | O_EXCL, 0644, NULL);
    if (qid < 0) {
        perror("mq_open");
        exit(EXIT_FAILURE);
    }

    size_t buflen = 65535;
    char *buf = (char *) malloc(buflen);

    bool running = true;
    do {
        unsigned int prio = 0;
        ssize_t ret = mq_receive(qid, buf, buflen - 2, &prio);
        if (ret > 3) {
            buf[ret] = 0;
            const int type = atoi(buf);
            const char *msg = &buf[1];
            printf("GOT MSG %d %s\n", type, msg);

        } else {
            perror("mq_receive");
            running = false;
        }

    } while(running);

    if (mq_close(qid) < 0) {
        perror("mq_close");
        abort();
    }

    free(buf);

    return EXIT_SUCCESS;
}